

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniNotRequired_Test::TestBody(TApp_IniNotRequired_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  AssertHelper local_568;
  Message local_560;
  int local_554;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_5;
  Message local_538;
  int local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_4;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0 [32];
  iterator local_4a0;
  size_type local_498;
  AssertHelper local_490;
  Message local_488;
  int local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_2;
  Message local_460;
  int local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_1;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  iterator local_3e8;
  size_type local_3e0;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  int local_2e4 [2];
  int three;
  int two;
  int one;
  ofstream out;
  allocator local_d1;
  string local_d0;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TempFile tmpini;
  TApp_IniNotRequired_Test *this_local;
  
  tmpini._name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"TestIniTmp.ini",&local_51);
  TempFile::TempFile((TempFile *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"--config",&local_89);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::__cxx11::string::string((string *)&local_b0,(string *)psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Read an ini file",&local_d1);
  CLI::App::set_config(&(this->super_TApp).app,&local_88,&local_b0,&local_d0,false);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::ofstream::ofstream(&two,psVar2,0x10);
  poVar3 = std::operator<<((ostream *)&two,"[default]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&two,"two=99");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&two,"three=3");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&two);
  three = 0;
  local_2e4[1] = 0;
  local_2e4[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"--one",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"",&local_331);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_308,&three,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_358,"--two",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"",&local_381);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_358,local_2e4 + 1,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"--three",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_3a8,local_2e4,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  gtest_ar.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_408,"--one=1",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_3e8 = &local_408;
  local_3e0 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_3e8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_618 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3e8;
  do {
    local_618 = local_618 + -1;
    std::__cxx11::string::~string((string *)local_618);
  } while (local_618 != &local_408);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_42c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_428,"1","one",&local_42c,&three);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  local_454 = 99;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_450,"99","two",&local_454,local_2e4 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  local_47c = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_478,"3","three",&local_47c,local_2e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  CLI::App::reset(&(this->super_TApp).app);
  local_2e4[0] = 0;
  local_2e4[1] = 0;
  three = 0;
  gtest_ar_3.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,"--one=1",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4c0,"--two=2",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 6));
  gtest_ar_3.message_.ptr_._5_1_ = 0;
  local_4a0 = &local_4e0;
  local_498 = 2;
  __l._M_len = 2;
  __l._M_array = local_4a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_6a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4a0;
  do {
    local_6a8 = local_6a8 + -1;
    std::__cxx11::string::~string((string *)local_6a8);
  } while (local_6a8 != &local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_504 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_500,"1","one",&local_504,&three);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_52c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_528,"2","two",&local_52c,local_2e4 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_554 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_550,"3","three",&local_554,local_2e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  TempFile::~TempFile((TempFile *)local_30);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequired) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    args = {"--one=1"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    one = two = three = 0;
    args = {"--one=1", "--two=2"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(2, two);
    EXPECT_EQ(3, three);
}